

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O1

Interval * tcu::operator*(Interval *__return_storage_ptr__,Interval *x,Interval *y)

{
  bool bVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  deRoundingMode dVar5;
  byte bVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  dVar12 = x->m_lo;
  if (dVar12 < x->m_hi || dVar12 == x->m_hi) {
    dVar11 = y->m_lo;
    if (dVar11 < y->m_hi || dVar11 == y->m_hi) {
      dVar5 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar11 = dVar11 * dVar12;
      dVar8 = dVar11;
      if (NAN(dVar11)) {
        dVar8 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      deSetRoundingMode(dVar5);
      dVar9 = y->m_hi;
      dVar5 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar12 = dVar12 * dVar9;
      dVar9 = dVar12;
      if (NAN(dVar12)) {
        dVar9 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      deSetRoundingMode(dVar5);
      dVar13 = (double)(-(ulong)NAN(dVar11) & 0xfff0000000000000 |
                       ~-(ulong)NAN(dVar11) & (ulong)dVar11);
      dVar10 = (double)(-(ulong)NAN(dVar12) & 0xfff0000000000000 |
                       ~-(ulong)NAN(dVar12) & (ulong)dVar12);
      bVar6 = -(NAN(dVar11) || NAN(dVar12));
      dVar11 = (double)(~-(ulong)(dVar8 <= dVar9) & (ulong)dVar9 |
                       (ulong)dVar8 & -(ulong)(dVar8 <= dVar9));
      uVar7 = -(ulong)(dVar10 <= dVar13);
      dVar12 = (double)(~uVar7 & (ulong)dVar10 | uVar7 & (ulong)dVar13);
    }
    else {
      bVar6 = 0;
      dVar11 = INFINITY;
      dVar12 = -INFINITY;
    }
    dVar9 = -INFINITY;
    dVar13 = INFINITY;
    bVar1 = y->m_hasNaN;
    dVar8 = y->m_lo;
    if (dVar8 < y->m_hi || dVar8 == y->m_hi) {
      dVar9 = x->m_hi;
      dVar5 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar8 = dVar8 * dVar9;
      dVar13 = dVar8;
      if (NAN(dVar8)) {
        dVar13 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      deSetRoundingMode(dVar5);
      dVar10 = y->m_hi;
      dVar5 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar9 = dVar9 * dVar10;
      dVar10 = dVar9;
      if (NAN(dVar9)) {
        dVar10 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      deSetRoundingMode(dVar5);
      dVar2 = (double)(-(ulong)NAN(dVar8) & 0xfff0000000000000 | ~-(ulong)NAN(dVar8) & (ulong)dVar8)
      ;
      dVar3 = (double)(-(ulong)NAN(dVar9) & 0xfff0000000000000 | ~-(ulong)NAN(dVar9) & (ulong)dVar9)
      ;
      bVar4 = (bool)((-NAN(dVar8) | -NAN(dVar9)) & 1);
      dVar13 = (double)(~-(ulong)(dVar13 <= dVar10) & (ulong)dVar10 |
                       (ulong)dVar13 & -(ulong)(dVar13 <= dVar10));
      uVar7 = -(ulong)(dVar3 <= dVar2);
      dVar9 = (double)(~uVar7 & (ulong)dVar3 | uVar7 & (ulong)dVar2);
    }
    else {
      bVar4 = false;
    }
    if ((y->m_hasNaN & 1U) != 0) {
      bVar4 = true;
    }
    if (((bVar1 | bVar6) & 1) != 0) {
      bVar4 = true;
    }
    dVar11 = (double)(~-(ulong)(dVar11 <= dVar13) & (ulong)dVar13 |
                     (ulong)dVar11 & -(ulong)(dVar11 <= dVar13));
    dVar12 = (double)(~-(ulong)(dVar9 <= dVar12) & (ulong)dVar9 |
                     (ulong)dVar12 & -(ulong)(dVar9 <= dVar12));
  }
  else {
    dVar12 = -INFINITY;
    dVar11 = INFINITY;
    bVar4 = false;
  }
  __return_storage_ptr__->m_hasNaN = bVar4;
  __return_storage_ptr__->m_lo = dVar11;
  __return_storage_ptr__->m_hi = dVar12;
  if (x->m_hasNaN == true) {
    dVar12 = __return_storage_ptr__->m_lo;
    dVar11 = __return_storage_ptr__->m_hi;
    if (INFINITY <= dVar12) {
      dVar12 = INFINITY;
    }
    if (dVar11 <= -INFINITY) {
      dVar11 = -INFINITY;
    }
    __return_storage_ptr__->m_hasNaN = true;
    __return_storage_ptr__->m_lo = dVar12;
    __return_storage_ptr__->m_hi = dVar11;
  }
  return __return_storage_ptr__;
}

Assistant:

Interval operator* (const Interval& x, const Interval& y)
{
	Interval ret;

	TCU_INTERVAL_APPLY_MONOTONE2(ret, xp, x, yp, y, val,
								 TCU_SET_INTERVAL(val, point, point = xp * yp));
	return ret;
}